

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

DataDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DataDeclarationSyntax,slang::syntax::DataDeclarationSyntax_const&>
          (BumpAllocator *this,DataDeclarationSyntax *args)

{
  DataDeclarationSyntax *this_00;
  
  this_00 = (DataDeclarationSyntax *)allocate(this,0xd8,8);
  slang::syntax::DataDeclarationSyntax::DataDeclarationSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }